

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

uint nullcDebugGetSourceLocationModuleIndex(char *sourceLocation)

{
  bool bVar1;
  long lVar2;
  uint *puVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong in_R9;
  
  if (sourceLocation != (char *)0x0) {
    if (NULLC::linker == 0) {
      uVar5 = 0;
      lVar2 = 0;
      lVar4 = 0;
    }
    else {
      uVar5 = *(uint *)(NULLC::linker + 0x28c);
      lVar2 = *(long *)(NULLC::linker + 0x280);
      lVar4 = *(long *)(NULLC::linker + 0x2a0);
    }
    if (uVar5 != 0) {
      puVar3 = (uint *)(lVar2 + 0x18);
      uVar6 = 0;
      do {
        bVar1 = true;
        if (((char *)((ulong)puVar3[-1] + lVar4) <= sourceLocation) &&
           (sourceLocation < (char *)((ulong)puVar3[-1] + lVar4) + *puVar3)) {
          bVar1 = false;
          in_R9 = uVar6 & 0xffffffff;
        }
        if (!bVar1) {
          return (uint)in_R9;
        }
        uVar6 = uVar6 + 1;
        puVar3 = puVar3 + 7;
      } while (uVar5 != uVar6);
    }
  }
  return 0xffffffff;
}

Assistant:

unsigned nullcDebugGetSourceLocationModuleIndex(const char *sourceLocation)
{
	if(!sourceLocation)
		return ~0u;

	unsigned moduleCount = 0;
	ExternModuleInfo *modules = nullcDebugModuleInfo(&moduleCount);

	const char* fullSource = nullcDebugSource();

	for(unsigned i = 0; i < moduleCount; i++)
	{
		ExternModuleInfo &moduleInfo = modules[i];

		const char *start = fullSource + moduleInfo.sourceOffset;
		const char *end = start + moduleInfo.sourceSize;

		if(sourceLocation >= start && sourceLocation < end)
			return i;
	}

	return ~0u;
}